

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O0

int create_ssdp_sock_v6_ula_gua(SOCKET *ssdpSock)

{
  sockaddr *psVar1;
  uint16_t uVar2;
  int iVar3;
  int *piVar4;
  int local_1c0;
  undefined4 local_1bc;
  int ret;
  int onOff;
  sockaddr_in6 *ssdpAddr6;
  sockaddr_storage __ss;
  ipv6_mreq ssdpMcastAddr;
  char errorBuffer [256];
  SOCKET *ssdpSock_local;
  
  _ret = (sockaddr *)&ssdpAddr6;
  iVar3 = socket(10,2,0);
  *ssdpSock = iVar3;
  if (*ssdpSock == -1) {
    piVar4 = __errno_location();
    __xpg_strerror_r(*piVar4,(undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),
                     0x100);
    UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x516,"Error in socket(): %s\n",
               (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
    ssdpSock_local._4_4_ = -0xcd;
  }
  else {
    local_1bc = 1;
    iVar3 = setsockopt(*ssdpSock,1,2,&local_1bc,4);
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      __xpg_strerror_r(*piVar4,(undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),
                       0x100);
      UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x527,
                 "Error in setsockopt() SO_REUSEADDR: %s\n",
                 (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
      local_1c0 = -0xd0;
    }
    else {
      local_1bc = 1;
      iVar3 = setsockopt(*ssdpSock,0x29,0x1a,&local_1bc,4);
      if (iVar3 == -1) {
        piVar4 = __errno_location();
        __xpg_strerror_r(*piVar4,(undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc)
                         ,0x100);
        UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x54b,
                   "Error in setsockopt() IPV6_V6ONLY: %s\n",
                   (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
        local_1c0 = -0xd0;
      }
      else {
        memset(&ssdpAddr6,0,0x80);
        _ret->sa_family = 10;
        psVar1 = _ret;
        *(undefined8 *)(_ret->sa_data + 6) = _in6addr_any;
        *(sockaddr_in6 **)(psVar1 + 1) = _fread;
        *(uint *)(_ret[1].sa_data + 6) = gIF_INDEX;
        uVar2 = htons(0x76c);
        *(uint16_t *)_ret->sa_data = uVar2;
        iVar3 = bind(*ssdpSock,_ret,0x1c);
        if (iVar3 == -1) {
          piVar4 = __errno_location();
          __xpg_strerror_r(*piVar4,(undefined1 *)
                                   ((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),0x100);
          UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x55c,
                     "Error in bind(), addr=0x%032lX, port=%d: %s\n",0,0x76c,
                     (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
          local_1c0 = -0xcb;
        }
        else {
          memset((void *)((long)&__ss.__ss_align + 4),0,0x14);
          ssdpMcastAddr.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = gIF_INDEX;
          inet_pton(10,"FF05::C",(void *)((long)&__ss.__ss_align + 4));
          iVar3 = setsockopt(*ssdpSock,0x29,0x14,(void *)((long)&__ss.__ss_align + 4),0x14);
          if (iVar3 == -1) {
            piVar4 = __errno_location();
            __xpg_strerror_r(*piVar4,(undefined1 *)
                                     ((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),0x100);
            UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x573,
                       "Error in setsockopt() IPV6_JOIN_GROUP (join multicast group): %s\n",
                       (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
            local_1c0 = -0xd0;
          }
          else {
            local_1bc = 1;
            iVar3 = setsockopt(*ssdpSock,1,6,&local_1bc,4);
            if (iVar3 == -1) {
              piVar4 = __errno_location();
              __xpg_strerror_r(*piVar4,(undefined1 *)
                                       ((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc),0x100);
              UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_server.c",0x585,
                         "Error in setsockopt() SO_BROADCAST (set broadcast): %s\n",
                         (undefined1 *)((long)&ssdpMcastAddr.ipv6mr_multiaddr.__in6_u + 0xc));
              local_1c0 = -200;
            }
            else {
              local_1c0 = 0;
            }
          }
        }
      }
    }
    if (local_1c0 != 0) {
      close(*ssdpSock);
    }
    ssdpSock_local._4_4_ = local_1c0;
  }
  return ssdpSock_local._4_4_;
}

Assistant:

static int create_ssdp_sock_v6_ula_gua(
	/*! [] SSDP IPv6 socket to be created. */
	SOCKET *ssdpSock)
{
	char errorBuffer[ERROR_BUFFER_LEN];
	struct ipv6_mreq ssdpMcastAddr;
	struct sockaddr_storage __ss;
	struct sockaddr_in6 *ssdpAddr6 = (struct sockaddr_in6 *)&__ss;
	int onOff;
	int ret = 0;

	*ssdpSock = socket(AF_INET6, SOCK_DGRAM, 0);
	if (*ssdpSock == INVALID_SOCKET) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in socket(): %s\n",
			errorBuffer);

		return UPNP_E_OUTOF_SOCKET;
	}
	onOff = 1;
	ret = setsockopt(*ssdpSock,
		SOL_SOCKET,
		SO_REUSEADDR,
		(char *)&onOff,
		sizeof(onOff));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() SO_REUSEADDR: %s\n",
			errorBuffer);
		ret = UPNP_E_SOCKET_ERROR;
		goto error_handler;
	}
		#if (defined(BSD) && !defined(__GNU__)) || defined(__APPLE__)
	onOff = 1;
	ret = setsockopt(*ssdpSock,
		SOL_SOCKET,
		SO_REUSEPORT,
		(char *)&onOff,
		sizeof(onOff));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() SO_REUSEPORT: %s\n",
			errorBuffer);
		ret = UPNP_E_SOCKET_ERROR;
		goto error_handler;
	}
		#endif /* BSD, __APPLE__ */
	onOff = 1;
	ret = setsockopt(*ssdpSock,
		IPPROTO_IPV6,
		IPV6_V6ONLY,
		(char *)&onOff,
		sizeof(onOff));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() IPV6_V6ONLY: %s\n",
			errorBuffer);
		ret = UPNP_E_SOCKET_ERROR;
		goto error_handler;
	}
	memset(&__ss, 0, sizeof(__ss));
	ssdpAddr6->sin6_family = (sa_family_t)AF_INET6;
	ssdpAddr6->sin6_addr = in6addr_any;
	ssdpAddr6->sin6_scope_id = gIF_INDEX;
	ssdpAddr6->sin6_port = htons(SSDP_PORT);
	ret = bind(*ssdpSock, (struct sockaddr *)ssdpAddr6, sizeof(*ssdpAddr6));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in bind(), addr=0x%032lX, port=%d: %s\n",
			0lu,
			SSDP_PORT,
			errorBuffer);
		ret = UPNP_E_SOCKET_BIND;
		goto error_handler;
	}
	memset((void *)&ssdpMcastAddr, 0, sizeof(ssdpMcastAddr));
	ssdpMcastAddr.ipv6mr_interface = gIF_INDEX;
	/* SITE LOCAL */
	inet_pton(
		AF_INET6, SSDP_IPV6_SITELOCAL, &ssdpMcastAddr.ipv6mr_multiaddr);
	ret = setsockopt(*ssdpSock,
		IPPROTO_IPV6,
		IPV6_JOIN_GROUP,
		(char *)&ssdpMcastAddr,
		sizeof(ssdpMcastAddr));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() IPV6_JOIN_GROUP (join multicast "
			"group): %s\n",
			errorBuffer);
		ret = UPNP_E_SOCKET_ERROR;
		goto error_handler;
	}
	onOff = 1;
	ret = setsockopt(*ssdpSock,
		SOL_SOCKET,
		SO_BROADCAST,
		(char *)&onOff,
		sizeof(onOff));
	if (ret == -1) {
		strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Error in setsockopt() SO_BROADCAST (set broadcast): "
			"%s\n",
			errorBuffer);
		ret = UPNP_E_NETWORK_ERROR;
		goto error_handler;
	}
	ret = UPNP_E_SUCCESS;

error_handler:
	if (ret != UPNP_E_SUCCESS) {
		UpnpCloseSocket(*ssdpSock);
	}

	return ret;
}